

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::createSubdivPlane
          (SceneGraph *this,Vec3fa *p0,Vec3fa *dx,Vec3fa *dy,size_t width,size_t height,
          float tessellationRate,Ref<embree::SceneGraph::MaterialNode> *material)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pvVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined8 uVar11;
  SubdivMeshNode *this_01;
  Vec3fa *pVVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  size_t sVar19;
  size_t sVar20;
  long lVar21;
  size_t sVar22;
  float fVar23;
  float fVar24;
  Ref<embree::SceneGraph::MaterialNode> local_50;
  long local_48;
  Node *local_40;
  Vec3fa *local_38;
  
  local_40 = (Node *)this;
  this_01 = (SubdivMeshNode *)operator_new(0x1b0);
  local_50 = (Ref<embree::SceneGraph::MaterialNode>)material->ptr;
  if (local_50.ptr != (MaterialNode *)0x0) {
    (*((local_50.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  SubdivMeshNode::SubdivMeshNode(this_01,&local_50,(BBox1f)0x3f80000000000000,1);
  (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
  if (local_50.ptr != (MaterialNode *)0x0) {
    (*((local_50.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  this_01->tessellationRate = tessellationRate;
  pvVar3 = (this_01->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar16 = width + 1;
  local_48 = height + 1;
  uVar14 = local_48 * lVar16;
  uVar15 = pvVar3->size_alloced;
  uVar18 = uVar15;
  if ((uVar15 < uVar14) && (uVar18 = uVar14, uVar15 != 0)) {
    while (uVar18 = uVar15, uVar18 < uVar14) {
      uVar15 = uVar18 * 2 + (ulong)(uVar18 * 2 == 0);
    }
  }
  if (uVar14 < pvVar3->size_active) {
    pvVar3->size_active = uVar14;
  }
  if (pvVar3->size_alloced == uVar18) {
    pvVar3->size_active = uVar14;
  }
  else {
    local_38 = pvVar3->items;
    pVVar12 = (Vec3fa *)alignedMalloc(uVar18 << 4,0x10);
    pvVar3->items = pVVar12;
    if (pvVar3->size_active != 0) {
      lVar13 = 0;
      uVar15 = 0;
      do {
        puVar1 = (undefined8 *)((long)&local_38->field_0 + lVar13);
        uVar11 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pvVar3->items->field_0 + lVar13);
        *puVar2 = *puVar1;
        puVar2[1] = uVar11;
        uVar15 = uVar15 + 1;
        lVar13 = lVar13 + 0x10;
      } while (uVar15 < pvVar3->size_active);
    }
    alignedFree(local_38);
    pvVar3->size_active = uVar14;
    pvVar3->size_alloced = uVar18;
  }
  this_00 = &this_01->position_indices;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(this_00,width * height * 4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this_01->verticesPerFace,width * height);
  lVar13 = 0;
  uVar15 = 0;
  do {
    fVar23 = (float)uVar15 / (float)height;
    uVar18 = 0;
    lVar17 = lVar13;
    do {
      fVar24 = (float)uVar18 / (float)width;
      fVar5 = (dx->field_0).m128[1];
      fVar6 = (dx->field_0).m128[2];
      fVar7 = (p0->field_0).m128[1];
      fVar8 = (p0->field_0).m128[2];
      fVar9 = (dy->field_0).m128[1];
      fVar10 = (dy->field_0).m128[2];
      *(float *)((long)&((this_01->positions).
                         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar17) =
           (dy->field_0).m128[0] * fVar23 + fVar24 * (dx->field_0).m128[0] + (p0->field_0).m128[0];
      *(float *)((long)&((this_01->positions).
                         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar17 + 4) =
           fVar9 * fVar23 + fVar24 * fVar5 + fVar7;
      *(float *)((long)&((this_01->positions).
                         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar17 + 8) =
           fVar10 * fVar23 + fVar24 * fVar6 + fVar8;
      uVar18 = uVar18 + 1;
      lVar17 = lVar17 + 0x10;
    } while (lVar16 + (ulong)(lVar16 == 0) != uVar18);
    uVar15 = uVar15 + 1;
    lVar13 = lVar13 + width * 0x10 + 0x10;
  } while (uVar15 != local_48 + (ulong)(local_48 == 0));
  if (height != 0) {
    uVar15 = (ulong)((int)width + 1);
    lVar16 = 0;
    lVar13 = 0;
    lVar17 = 0;
    sVar20 = 0;
    sVar19 = width;
    do {
      if (width != 0) {
        sVar22 = 0;
        lVar21 = lVar16;
        do {
          iVar4 = (int)sVar22;
          *(int *)((long)(this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start + lVar21) = (int)lVar17 + iVar4;
          *(int *)((long)(this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start + lVar21 + 4) =
               (int)lVar17 + iVar4 + 1;
          *(int *)((long)(this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start + lVar21 + 8) =
               (int)sVar19 + 2 + iVar4;
          *(int *)((long)(this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start + lVar21 + 0xc) =
               (int)sVar19 + 1 + iVar4;
          *(undefined4 *)
           ((long)(this_01->verticesPerFace).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start + sVar22 * 4 + lVar13) = 4;
          sVar22 = sVar22 + 1;
          lVar21 = lVar21 + 0x10;
        } while (width != sVar22);
      }
      sVar20 = sVar20 + 1;
      sVar19 = sVar19 + uVar15;
      lVar17 = lVar17 + uVar15;
      lVar13 = lVar13 + width * 4;
      lVar16 = lVar16 + width * 0x10;
    } while (sVar20 != height);
  }
  this_01->position_subdiv_mode = RTC_SUBDIVISION_MODE_PIN_CORNERS;
  (local_40->super_RefCount)._vptr_RefCount = (_func_int **)this_01;
  (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
  (*(this_01->super_Node).super_RefCount._vptr_RefCount[3])(this_01);
  return (Ref<embree::SceneGraph::Node>)local_40;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createSubdivPlane (const Vec3fa& p0, const Vec3fa& dx, const Vec3fa& dy, size_t width, size_t height, float tessellationRate, Ref<MaterialNode> material)
  {
    Ref<SceneGraph::SubdivMeshNode> mesh = new SceneGraph::SubdivMeshNode(material,BBox1f(0,1),1);
    mesh->tessellationRate = tessellationRate;
    mesh->positions[0].resize((width+1)*(height+1));
    mesh->position_indices.resize(4*width*height);
    mesh->verticesPerFace.resize(width*height);

    for (size_t y=0; y<=height; y++) {
      for (size_t x=0; x<=width; x++) {
        Vec3fa p = p0+float(x)/float(width)*dx+float(y)/float(height)*dy;
        size_t i = y*(width+1)+x;
        mesh->positions[0][i].x = p.x;
        mesh->positions[0][i].y = p.y;
        mesh->positions[0][i].z = p.z;
      }
    }
    for (size_t y=0; y<height; y++) {
      for (size_t x=0; x<width; x++) {
        size_t i = y*width+x;
        size_t p00 = (y+0)*(width+1)+(x+0);
        size_t p01 = (y+0)*(width+1)+(x+1);
        size_t p10 = (y+1)*(width+1)+(x+0);
        size_t p11 = (y+1)*(width+1)+(x+1);
        mesh->position_indices[4*i+0] = unsigned(p00); 
        mesh->position_indices[4*i+1] = unsigned(p01); 
        mesh->position_indices[4*i+2] = unsigned(p11); 
        mesh->position_indices[4*i+3] = unsigned(p10);
        mesh->verticesPerFace[i] = 4;
      }
    }
    mesh->position_subdiv_mode = RTC_SUBDIVISION_MODE_PIN_CORNERS;
    return mesh.dynamicCast<SceneGraph::Node>();
  }